

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::RepeatedWellKnownTypes::Clear(RepeatedWellKnownTypes *this)

{
  uint32_t cached_has_bits;
  RepeatedWellKnownTypes *this_local;
  
  google::protobuf::RepeatedPtrField<google::protobuf::Any>::Clear
            (&(this->field_0)._impl_.any_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::Api>::Clear
            (&(this->field_0)._impl_.api_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::Duration>::Clear
            (&(this->field_0)._impl_.duration_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::Empty>::Clear
            (&(this->field_0)._impl_.empty_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::FieldMask>::Clear
            (&(this->field_0)._impl_.field_mask_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::SourceContext>::Clear
            (&(this->field_0)._impl_.source_context_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::Struct>::Clear
            (&(this->field_0)._impl_.struct_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::Timestamp>::Clear
            (&(this->field_0)._impl_.timestamp_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::Type>::Clear
            (&(this->field_0)._impl_.type_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::DoubleValue>::Clear
            (&(this->field_0)._impl_.double_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::FloatValue>::Clear
            (&(this->field_0)._impl_.float_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::Int64Value>::Clear
            (&(this->field_0)._impl_.int64_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::UInt64Value>::Clear
            (&(this->field_0)._impl_.uint64_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::Int32Value>::Clear
            (&(this->field_0)._impl_.int32_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::UInt32Value>::Clear
            (&(this->field_0)._impl_.uint32_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::BoolValue>::Clear
            (&(this->field_0)._impl_.bool_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::StringValue>::Clear
            (&(this->field_0)._impl_.string_field_);
  google::protobuf::RepeatedPtrField<google::protobuf::BytesValue>::Clear
            (&(this->field_0)._impl_.bytes_field_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedWellKnownTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.RepeatedWellKnownTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.any_field_.Clear();
  _impl_.api_field_.Clear();
  _impl_.duration_field_.Clear();
  _impl_.empty_field_.Clear();
  _impl_.field_mask_field_.Clear();
  _impl_.source_context_field_.Clear();
  _impl_.struct_field_.Clear();
  _impl_.timestamp_field_.Clear();
  _impl_.type_field_.Clear();
  _impl_.double_field_.Clear();
  _impl_.float_field_.Clear();
  _impl_.int64_field_.Clear();
  _impl_.uint64_field_.Clear();
  _impl_.int32_field_.Clear();
  _impl_.uint32_field_.Clear();
  _impl_.bool_field_.Clear();
  _impl_.string_field_.Clear();
  _impl_.bytes_field_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}